

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnreach.c
# Opt level: O3

DdNode * Abc_NtkTransitionRelation(DdManager *dd,Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  FILE *pFVar5;
  uint uVar6;
  DdNode *pDVar7;
  void *__ptr;
  undefined8 uVar8;
  DdNode *pDVar9;
  Vec_Ptr_t *pVVar10;
  DdNode *pDVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  
  if (dd->size != pNtk->vCis->nSize) {
    __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcUnreach.c"
                  ,0x87,"DdNode *Abc_NtkTransitionRelation(DdManager *, Abc_Ntk_t *, int)");
  }
  Cudd_bddIthVar(dd,dd->size + pNtk->nObjCounts[8] + -1);
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  pDVar7 = dd->one;
  Cudd_Ref(pDVar7);
  pVVar10 = pNtk->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    pDVar11 = pDVar7;
    do {
      plVar3 = (long *)pVVar10->pArray[lVar14];
      pDVar7 = pDVar11;
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        pDVar7 = Cudd_bddIthVar(dd,pNtk->vCis->nSize + (int)lVar14);
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        lVar12 = *(long *)(*plVar3 + 0x1b0);
        if (*(int *)(lVar12 + 4) < 8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar4 = *(int **)(*(long *)(lVar12 + 8) + 0x38);
        __ptr = *(void **)(piVar4 + 2);
        if (__ptr == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar1 = (int)plVar3[2];
        lVar12 = (long)iVar1;
        iVar2 = *piVar4;
        if (iVar2 <= iVar1) {
          iVar13 = iVar1 + 10;
          if (iVar1 < iVar2 * 2) {
            iVar13 = iVar2 * 2;
          }
          if (iVar2 < iVar13) {
            __ptr = realloc(__ptr,(long)iVar13 * 8);
            *(void **)(piVar4 + 2) = __ptr;
            memset((void *)((long)*piVar4 * 8 + (long)__ptr),0,((long)iVar13 - (long)*piVar4) * 8);
            *piVar4 = iVar13;
          }
        }
        pDVar9 = *(DdNode **)((long)__ptr + lVar12 * 8);
        if (pDVar9 == (DdNode *)0x0) {
          if (*(code **)(piVar4 + 8) == (code *)0x0) {
            pDVar9 = (DdNode *)0x0;
          }
          else {
            uVar8 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
            *(undefined8 *)(*(long *)(piVar4 + 2) + lVar12 * 8) = uVar8;
            pDVar9 = *(DdNode **)(*(long *)(piVar4 + 2) + lVar12 * 8);
          }
        }
        pDVar9 = Cudd_bddXnor(dd,pDVar7,pDVar9);
        Cudd_Ref(pDVar9);
        pDVar7 = Cudd_bddAnd(dd,pDVar11,pDVar9);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,pDVar11);
        Cudd_RecursiveDeref(dd,pDVar9);
        pVVar10 = pNtk->vBoxes;
      }
      lVar14 = lVar14 + 1;
      pDVar11 = pDVar7;
    } while (lVar14 < pVVar10->nSize);
  }
  Abc_NtkFreeGlobalBdds(pNtk,0);
  pDVar11 = Extra_bddComputeRangeCube(dd,0,pNtk->vPis->nSize);
  Cudd_Ref(pDVar11);
  pDVar9 = Cudd_bddExistAbstract(dd,pDVar7,pDVar11);
  Cudd_Ref(pDVar9);
  Cudd_RecursiveDeref(dd,pDVar7);
  Cudd_RecursiveDeref(dd,pDVar11);
  pFVar5 = _stdout;
  if (fVerbose == 0) {
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    Cudd_AutodynDisable(dd);
  }
  else {
    uVar6 = Cudd_DagSize(pDVar9);
    fprintf(pFVar5,"BDD nodes in the transition relation before reordering %d.\n",(ulong)uVar6);
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    Cudd_AutodynDisable(dd);
    pFVar5 = _stdout;
    uVar6 = Cudd_DagSize(pDVar9);
    fprintf(pFVar5,"BDD nodes in the transition relation after reordering %d.\n",(ulong)uVar6);
  }
  Cudd_Deref(pDVar9);
  return pDVar9;
}

Assistant:

DdNode * Abc_NtkTransitionRelation( DdManager * dd, Abc_Ntk_t * pNtk, int fVerbose )
{
    DdNode * bRel, * bTemp, * bProd, * bVar, * bInputs;
    Abc_Obj_t * pNode;
    int fReorder = 1;
    int i;

    // extand the BDD manager to represent NS variables
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    Cudd_bddIthVar( dd, Abc_NtkCiNum(pNtk) + Abc_NtkLatchNum(pNtk) - 1 );

    // enable reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    else
        Cudd_AutodynDisable( dd );

    // compute the transition relation
    bRel = b1;   Cudd_Ref( bRel );
    Abc_NtkForEachLatch( pNtk, pNode, i )
    {
        bVar  = Cudd_bddIthVar( dd, Abc_NtkCiNum(pNtk) + i );
//        bProd = Cudd_bddXnor( dd, bVar, pNtk->vFuncsGlob->pArray[i] );  Cudd_Ref( bProd );
        bProd = Cudd_bddXnor( dd, bVar, (DdNode *)Abc_ObjGlobalBdd(Abc_ObjFanin0(pNode)) );  Cudd_Ref( bProd );
        bRel  = Cudd_bddAnd( dd, bTemp = bRel, bProd );                 Cudd_Ref( bRel );
        Cudd_RecursiveDeref( dd, bTemp ); 
        Cudd_RecursiveDeref( dd, bProd ); 
    }
    // free the global BDDs
//    Abc_NtkFreeGlobalBdds( pNtk );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // quantify the PI variables
    bInputs = Extra_bddComputeRangeCube( dd, 0, Abc_NtkPiNum(pNtk) );    Cudd_Ref( bInputs );
    bRel    = Cudd_bddExistAbstract( dd, bTemp = bRel, bInputs );    Cudd_Ref( bRel );
    Cudd_RecursiveDeref( dd, bTemp ); 
    Cudd_RecursiveDeref( dd, bInputs ); 

    // reorder and disable reordering
    if ( fReorder )
    {
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the transition relation before reordering %d.\n", Cudd_DagSize(bRel) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        Cudd_AutodynDisable( dd );
        if ( fVerbose )
            fprintf( stdout, "BDD nodes in the transition relation after reordering %d.\n", Cudd_DagSize(bRel) );
    }
    Cudd_Deref( bRel );
    return bRel;
}